

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec.c
# Opt level: O2

void tetra_decode(tetra_codec *st,uint8_t *coded,int16_t *pcm,int bfi)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int16_t parm [24];
  int16_t serial [138];
  
  serial[0] = (int16_t)(bfi != 0);
  uVar2 = 7;
  for (lVar1 = 1; lVar1 != 0x8a; lVar1 = lVar1 + 1) {
    serial[lVar1] = (ushort)((*coded >> (uVar2 & 0x1f) & 1) != 0);
    uVar3 = uVar2 - 1;
    if ((int)uVar2 < 1) {
      uVar3 = 7;
    }
    coded = coded + ((int)uVar2 < 1);
    uVar2 = uVar3;
  }
  Bits2prm_Tetra(st,serial,parm);
  Decod_Tetra(st,parm,pcm);
  Post_Process(st,pcm,0xf0);
  return;
}

Assistant:

void tetra_decode(tetra_codec* st, const uint8_t* coded, int16_t* pcm, int bfi)
{
	int16_t serial[1 + CODED_FRAME_BIT_COUNT];
	serial[0] = bfi ? 1 : 0;
	unpack_coded_bits(coded, serial + 1);

	int16_t parm[24];
	Bits2prm_Tetra(st, serial, parm);

	Decod_Tetra(st, parm, pcm);

	Post_Process(st, pcm, TSC_L_frame);
}